

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t * gs_c_fn_V3(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  vec3 v;
  undefined1 local_48 [8];
  gs_val_t sig;
  gs_val_type gStack_28;
  int signature_arg_count;
  gs_val_type signature_arg_types [3];
  int num_vals_local;
  gs_val_t *vals_local;
  gs_eval_t *eval_local;
  
  _gStack_28 = 0x300000003;
  signature_arg_types[0] = GS_VAL_FLOAT;
  sig.field_2._12_4_ = 3;
  signature_arg_types[1] = num_vals;
  unique0x100000d3 = vals;
  gs_c_fn_signature((gs_val_t *)local_48,eval,vals,num_vals,&gStack_28,3);
  if ((local_48._4_4_ & 1) == 0) {
    v = vec3_create((stack0xffffffffffffffe8->field_2).float_val,
                    stack0xffffffffffffffe8[1].field_2.float_val,
                    stack0xffffffffffffffe8[2].field_2.float_val);
    gs_val_vec3(__return_storage_ptr__,v);
  }
  else {
    __return_storage_ptr__->type = local_48._0_4_;
    __return_storage_ptr__->is_return = (_Bool)(char)local_48._4_4_;
    *(int3 *)&__return_storage_ptr__->field_0x5 = SUB43(local_48._4_4_,1);
    (__return_storage_ptr__->field_2).vec2_val = (vec2)sig._0_8_;
    *(vec2 *)((long)&__return_storage_ptr__->field_2 + 8) = sig.field_2.vec2_val;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_V3(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_FLOAT, GS_VAL_FLOAT, GS_VAL_FLOAT };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);;
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    return gs_val_vec3(V3(vals[0].float_val, vals[1].float_val, vals[2].float_val));
}